

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O3

size_t iDynTree::countUnknowns(Traversal *traversal,LinkUnknownWrenchContacts *unknownWrenches)

{
  pointer pvVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  size_t sVar7;
  
  iVar3 = iDynTree::Traversal::getNrOfVisitedLinks();
  if ((int)(iVar3 - 1U) < 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    uVar6 = (ulong)(iVar3 - 1U);
    do {
      iDynTree::Traversal::getLink((long)traversal);
      lVar4 = iDynTree::Link::getIndex();
      pvVar1 = (unknownWrenches->m_linkUnknownWrenchContacts).
               super__Vector_base<std::vector<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>,_std::allocator<std::vector<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar5 = *(int **)&pvVar1[lVar4].
                         super__Vector_base<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>
                         ._M_impl;
      lVar4 = (long)*(pointer *)
                     ((long)&pvVar1[lVar4].
                             super__Vector_base<iDynTree::UnknownWrenchContact,_std::allocator<iDynTree::UnknownWrenchContact>_>
                             ._M_impl + 8) - (long)piVar5;
      if (lVar4 != 0) {
        lVar4 = (lVar4 >> 3) * -0x1111111111111111;
        lVar4 = lVar4 + (ulong)(lVar4 == 0);
        do {
          iVar3 = *piVar5;
          if (iVar3 == 2) {
            sVar7 = sVar7 + 1;
          }
          else if (iVar3 == 1) {
            sVar7 = sVar7 + 3;
          }
          else if (iVar3 == 0) {
            sVar7 = sVar7 + 6;
          }
          piVar5 = piVar5 + 0x1e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      bVar2 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
  }
  return sVar7;
}

Assistant:

size_t countUnknowns(const Traversal& traversal, const LinkUnknownWrenchContacts& unknownWrenches)
{
    size_t unknowns = 0;

    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();

        // While we are in this loop, we also keep track of the number of unknowns
        for(size_t contact = 0;
            contact < unknownWrenches.getNrOfContactsForLink(visitedLinkIndex);
            contact++ )
        {
            const UnknownWrenchContact & unknownWrench = unknownWrenches.contactWrench(visitedLinkIndex,contact);

            switch( unknownWrench.unknownType )
            {
                case FULL_WRENCH:
                    unknowns += 6;
                    break;
                case PURE_FORCE:
                    unknowns += 3;
                    break;
                case PURE_FORCE_WITH_KNOWN_DIRECTION:
                    unknowns += 1;
                    break;
                case NO_UNKNOWNS:
                    //unknowns += 0;
                    break;
                default:
                    assert(false);
                    break;
            }
        }
    }

    return unknowns;
}